

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int same_symbol(symbol *a,symbol *b)

{
  int local_24;
  int i;
  symbol *b_local;
  symbol *a_local;
  
  if (a == b) {
    a_local._4_4_ = 1;
  }
  else if (a->type == MULTITERMINAL) {
    if (b->type == MULTITERMINAL) {
      if (a->nsubsym == b->nsubsym) {
        for (local_24 = 0; local_24 < a->nsubsym; local_24 = local_24 + 1) {
          if (a->subsym[local_24] != b->subsym[local_24]) {
            return 0;
          }
        }
        a_local._4_4_ = 1;
      }
      else {
        a_local._4_4_ = 0;
      }
    }
    else {
      a_local._4_4_ = 0;
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int same_symbol(struct symbol *a, struct symbol *b)
{
  int i;
  if( a==b ) return 1;
  if( a->type!=MULTITERMINAL ) return 0;
  if( b->type!=MULTITERMINAL ) return 0;
  if( a->nsubsym!=b->nsubsym ) return 0;
  for(i=0; i<a->nsubsym; i++){
    if( a->subsym[i]!=b->subsym[i] ) return 0;
  }
  return 1;
}